

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O3

string * __thiscall
vkt::shaderexecutor::(anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs,
          char *inputPrefix,char *outputPrefix)

{
  ostream *poVar1;
  string *psVar2;
  int iVar3;
  undefined8 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ostringstream src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  DeclareVariable local_228;
  DeclareVariable local_1e8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#version 310 es\nlayout(location = ",0x22);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") in highp vec4 a_position;\n",0x1c);
  __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
  if (__rhs != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8)) {
    iVar3 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = ",0x12);
      poVar1 = (ostream *)std::ostream::operator<<(local_1a8,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,") in ",5);
      std::operator+(&local_248,"a_",__rhs);
      glu::decl::DeclareVariable::DeclareVariable(&local_1e8,(VarType *)(__rhs + 1),&local_248,0);
      poVar1 = glu::decl::operator<<(poVar1,&local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"layout(location = ",0x12);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3 + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,") flat out ",0xb);
      std::operator+(&local_268,"vtx_out_",__rhs);
      glu::decl::DeclareVariable::DeclareVariable(&local_228,(VarType *)(__rhs + 1),&local_268,0);
      poVar1 = glu::decl::operator<<(poVar1,&local_228);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.name._M_dataplus._M_p != &local_228.name.field_2) {
        operator_delete(local_228.name._M_dataplus._M_p,
                        local_228.name.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_228.varType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
        operator_delete(local_1e8.name._M_dataplus._M_p,
                        local_1e8.name.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_1e8.varType);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      iVar3 = iVar3 + 1;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&__rhs[1].field_2 + 8);
    } while (__rhs != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (this + 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tgl_PointSize = 1.0;\n",0x15);
  puVar4 = *(undefined8 **)this;
  if (puVar4 != *(undefined8 **)(this + 8)) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vtx_out_",8);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)*puVar4,puVar4[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"a_",2);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)*puVar4,puVar4[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
      puVar4 = puVar4 + 7;
    } while (puVar4 != *(undefined8 **)(this + 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  psVar2 = (string *)std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string generatePassthroughVertexShader (const std::vector<Symbol>& inputs, const char* inputPrefix, const char* outputPrefix)
{

	std::ostringstream	src;
	int					location	= 0;

	src <<	"#version 310 es\n"
			"layout(location = " << location << ") in highp vec4 a_position;\n";

	for (vector<Symbol>::const_iterator input = inputs.begin(); input != inputs.end(); ++input)
	{
		location++;
		src << "layout(location = "<< location << ") in " << glu::declare(input->varType, inputPrefix + input->name) << ";\n"
			<< "layout(location = " << location - 1 << ") flat out " << glu::declare(input->varType, outputPrefix + input->name) << ";\n";
	}

	src << "\nvoid main (void)\n{\n"
		<< "	gl_Position = a_position;\n"
		<< "	gl_PointSize = 1.0;\n";

	for (vector<Symbol>::const_iterator input = inputs.begin(); input != inputs.end(); ++input)
		src << "\t" << outputPrefix << input->name << " = " << inputPrefix << input->name << ";\n";

	src << "}\n";

	return src.str();
}